

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTrav.c
# Opt level: O3

void Tim_ManIncrementTravId(Tim_Man_t *p)

{
  Tim_Obj_t *pTVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  int iVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  
  auVar2 = _DAT_0094e250;
  iVar3 = p->nTravIds;
  if (0x3ffffffe < iVar3) {
    iVar3 = p->nCis;
    if (0 < (long)iVar3) {
      pTVar1 = p->pCis;
      lVar4 = (long)iVar3 + -1;
      auVar5._8_4_ = (int)lVar4;
      auVar5._0_8_ = lVar4;
      auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 0;
      auVar5 = auVar5 ^ _DAT_0094e250;
      auVar12 = _DAT_0094f530;
      auVar9 = _DAT_0094e240;
      do {
        auVar11 = auVar9 ^ auVar2;
        iVar7 = auVar5._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar7 && auVar5._0_4_ < auVar11._0_4_ || iVar7 < auVar11._4_4_
                    ) & 1)) {
          *(undefined4 *)((long)&pTVar1->TravId + lVar4) = 0;
        }
        if ((auVar11._12_4_ != auVar5._12_4_ || auVar11._8_4_ <= auVar5._8_4_) &&
            auVar11._12_4_ <= auVar5._12_4_) {
          *(undefined4 *)((long)&pTVar1[1].TravId + lVar4) = 0;
        }
        auVar11 = auVar12 ^ auVar2;
        iVar13 = auVar11._4_4_;
        if (iVar13 <= iVar7 && (iVar13 != iVar7 || auVar11._0_4_ <= auVar5._0_4_)) {
          *(undefined4 *)((long)&pTVar1[2].TravId + lVar4) = 0;
          *(undefined4 *)((long)&pTVar1[3].TravId + lVar4) = 0;
        }
        lVar8 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar8 + 4;
        lVar8 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 4;
        auVar12._8_8_ = lVar8 + 4;
        lVar4 = lVar4 + 0x60;
      } while ((ulong)(iVar3 + 3U >> 2) * 0x60 != lVar4);
    }
    auVar2 = _DAT_0094e250;
    iVar3 = p->nCos;
    if (0 < (long)iVar3) {
      pTVar1 = p->pCos;
      lVar4 = (long)iVar3 + -1;
      auVar6._8_4_ = (int)lVar4;
      auVar6._0_8_ = lVar4;
      auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 0;
      auVar6 = auVar6 ^ _DAT_0094e250;
      auVar11 = _DAT_0094f530;
      auVar10 = _DAT_0094e240;
      do {
        auVar12 = auVar10 ^ auVar2;
        iVar7 = auVar6._4_4_;
        if ((bool)(~(auVar12._4_4_ == iVar7 && auVar6._0_4_ < auVar12._0_4_ || iVar7 < auVar12._4_4_
                    ) & 1)) {
          *(undefined4 *)((long)&pTVar1->TravId + lVar4) = 0;
        }
        if ((auVar12._12_4_ != auVar6._12_4_ || auVar12._8_4_ <= auVar6._8_4_) &&
            auVar12._12_4_ <= auVar6._12_4_) {
          *(undefined4 *)((long)&pTVar1[1].TravId + lVar4) = 0;
        }
        auVar12 = auVar11 ^ auVar2;
        iVar13 = auVar12._4_4_;
        if (iVar13 <= iVar7 && (iVar13 != iVar7 || auVar12._0_4_ <= auVar6._0_4_)) {
          *(undefined4 *)((long)&pTVar1[2].TravId + lVar4) = 0;
          *(undefined4 *)((long)&pTVar1[3].TravId + lVar4) = 0;
        }
        lVar8 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 4;
        auVar10._8_8_ = lVar8 + 4;
        lVar8 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 4;
        auVar11._8_8_ = lVar8 + 4;
        lVar4 = lVar4 + 0x60;
      } while ((ulong)(iVar3 + 3U >> 2) * 0x60 != lVar4);
    }
    iVar3 = 0;
  }
  p->nTravIds = iVar3 + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Increments the trav ID of the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Tim_ManIncrementTravId( Tim_Man_t * p )
{
    int i;
    if ( p->nTravIds >= (1<<30)-1 )
    {
        p->nTravIds = 0;
        for ( i = 0; i < p->nCis; i++ )
            p->pCis[i].TravId = 0;
        for ( i = 0; i < p->nCos; i++ )
            p->pCos[i].TravId = 0;
    }
    assert( p->nTravIds < (1<<30)-1 );
    p->nTravIds++;
}